

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

int nn_sock_recv(nn_sock *self,nn_msg *msg,int flags)

{
  nn_ctx *self_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  
  if ((self->socktype->flags & 1) == 0) {
    self_00 = &self->ctx;
    nn_ctx_enter(self_00);
    if (self->rcvtimeo < 0) {
      lVar5 = 0xffffffff;
      uVar6 = 0xffffffffffffffff;
    }
    else {
      uVar4 = nn_clock_ms();
      lVar5 = (long)self->rcvtimeo;
      uVar6 = uVar4 + lVar5;
    }
    while (uVar1 = self->state - 3, 3 < uVar1) {
      iVar2 = (*self->sockbase->vfptr->recv)(self->sockbase,msg);
      iVar3 = 0;
      if (iVar2 == 0) goto LAB_00120fe6;
      if (-1 < iVar2) {
        nn_sock_recv_cold_2();
        iVar3 = extraout_EAX;
        goto LAB_00120fe6;
      }
      iVar3 = iVar2;
      if (iVar2 != -0xb) goto LAB_00120fe6;
      nn_ctx_leave(self_00);
      if ((flags & 1U) != 0) {
        return -0xb;
      }
      uVar1 = nn_efd_wait(&self->rcvfd,(int)lVar5);
      if (uVar1 != 0) {
        if (uVar1 == 0xffffff92) {
          return -0x6e;
        }
        if (uVar1 == 0xfffffffc) {
          return -4;
        }
        if (uVar1 == 0xfffffff7) {
          return -9;
        }
        uVar6 = (ulong)uVar1;
        nn_sock_recv_cold_1();
        iVar3 = (**(code **)(**(long **)(uVar6 + 0x60) + 0x10))();
        if (-1 < iVar3) {
          *(int *)(uVar6 + 0x1e8) = *(int *)(uVar6 + 0x1e8) + 1;
        }
        return iVar3;
      }
      nn_ctx_enter(self_00);
      iVar3 = nn_efd_wait(&self->rcvfd,0);
      if (iVar3 == 0) {
        *(byte *)&self->flags = (byte)self->flags | 1;
      }
      if (-1 < self->rcvtimeo) {
        uVar4 = nn_clock_ms();
        lVar5 = 0;
        if (uVar4 <= uVar6) {
          lVar5 = uVar6 - uVar4;
        }
      }
    }
    iVar3 = *(int *)(&DAT_00132440 + (ulong)uVar1 * 4);
LAB_00120fe6:
    nn_ctx_leave(self_00);
  }
  else {
    iVar3 = -0x5f;
  }
  return iVar3;
}

Assistant:

int nn_sock_recv (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for receiving messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for RCVTIMEO timer. */
    if (self->rcvtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->rcvtimeo;
        timeout = self->rcvtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_ZOMBIE:
            /*  If nn_term() was already called, return ETERM. */
            nn_ctx_leave (&self->ctx);
            return -ETERM;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to receive the message in a non-blocking way. */
        rc = self->sockbase->vfptr->recv (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be received at the moment and the recv call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking recv, wait while there are new pipes available
            for receiving. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->rcvfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for receiving
         */
        if (!nn_efd_wait (&self->rcvfd, 0)) {
            self->flags |= NN_SOCK_FLAG_IN;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->rcvtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}